

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O3

string * __thiscall
ut11::utility::detail::ParseNonIterableToString<IsNotNaNTests::Run()::NotANumber>::
ToString_abi_cxx11_(void *__return_storage_ptr__)

{
  stringstream stream;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"[",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"ZN13IsNotNaNTests3RunEvE10NotANumber",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return (string *)__return_storage_ptr__;
}

Assistant:

inline std::string ToString(const V& value, std::false_type) const
				{
					std::stringstream stream;
					stream << "[" << typeid(V).name() << "]";
					return stream.str();
				}